

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,string *filename)

{
  cmake *pcVar1;
  cmDebuggerAdapter *this_00;
  bool bVar2;
  bool bVar3;
  string *in_base;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string filenametoread;
  ListFileScope scope;
  cmListFile listFile;
  string local_88;
  ListFileScope local_68;
  cmStateDirectory local_58;
  
  cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
  in_base = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_58);
  cmsys::SystemTools::CollapseFullPath(&local_88,filename,in_base);
  ListFileScope::ListFileScope(&local_68,this,&local_88);
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  peVar4 = (pcVar1->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (pcVar1->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (peVar4 != (element_type *)0x0) {
LAB_0028247a:
      bVar2 = true;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_00282489;
    }
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    if (peVar4 != (element_type *)0x0) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      peVar4 = (pcVar1->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = (pcVar1->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0028247a;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
      bVar2 = false;
LAB_00282489:
      cmDebugger::cmDebuggerAdapter::OnBeginFileParse(peVar4,this,&local_88);
      if (!bVar2) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
    }
  }
  local_58.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  local_58.DirectoryState.Position = 0;
  local_58.Snapshot_.State = (cmState *)0x0;
  bVar2 = cmListFile::ParseFile
                    ((cmListFile *)&local_58,local_88._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,&this->Backtrace);
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  peVar4 = (pcVar1->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (pcVar1->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (!bVar2) {
    if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (peVar4 == (element_type *)0x0) goto LAB_0028268c;
LAB_002825ca:
      bVar3 = true;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if (peVar4 == (element_type *)0x0) goto LAB_0028268c;
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      peVar4 = (pcVar1->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = (pcVar1->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002825ca;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
      bVar3 = false;
    }
    cmDebugger::cmDebuggerAdapter::OnEndFileParse(peVar4);
    if (!bVar3) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    goto LAB_0028268c;
  }
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (peVar4 != (element_type *)0x0) {
LAB_0028257e:
      bVar3 = true;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_002825dd;
    }
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    if (peVar4 != (element_type *)0x0) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      peVar4 = (pcVar1->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = (pcVar1->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0028257e;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
      bVar3 = false;
LAB_002825dd:
      cmDebugger::cmDebuggerAdapter::OnEndFileParse(peVar4);
      if (!bVar3) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      this_00 = (pcVar1->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      p_Var5 = (pcVar1->DebugAdapter).
               super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      cmDebugger::cmDebuggerAdapter::OnFileParsedSuccessfully
                (this_00,&local_88,
                 (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_58);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
    }
  }
  RunListFile(this,(cmListFile *)&local_58,&local_88,(DeferCommands *)0x0);
  if ((cmSystemTools::s_FatalErrorOccurred != false) ||
     (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) {
    local_68.ReportError = false;
  }
LAB_0028268c:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_58);
  ListFileScope::~ListFileScope(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ReadListFile(const std::string& filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnBeginFileParse(
      this, filenametoread);
  }
#endif

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
#ifdef CMake_ENABLE_DEBUGGER
    if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
      this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    }
#endif

    return false;
  }

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    this->GetCMakeInstance()->GetDebugAdapter()->OnFileParsedSuccessfully(
      filenametoread, listFile.Functions);
  }
#endif

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }
  return true;
}